

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

int __thiscall
CVmObjByteArray::getp_copy_from(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  ulong uVar3;
  unsigned_long cnt;
  unsigned_long src_idx;
  ulong start_idx;
  CVmObjByteArray *src_arr;
  
  if (getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_copy_from();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_copy_from::desc);
  if (iVar1 == 0) {
    vVar2 = CVmBif::pop_obj_val();
    iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[vVar2 >> 0xc][vVar2 & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[vVar2 >> 0xc] + (vVar2 & 0xfff),metaclass_reg_);
    if (iVar1 == 0) {
      err_throw(0x900);
    }
    src_arr = (CVmObjByteArray *)
              ((long)&G_obj_table_X.pages_[vVar2 >> 0xc]->ptr_ + (ulong)((vVar2 & 0xfff) * 0x18));
    iVar1 = CVmBif::pop_int_val();
    src_idx = 1;
    if (iVar1 != 0) {
      src_idx = (ulong)*(uint *)(src_arr->super_CVmObject).ext_ + 1;
      if ((ulong)(long)iVar1 <= src_idx) {
        src_idx = (long)iVar1;
      }
    }
    iVar1 = CVmBif::pop_int_val();
    start_idx = 1;
    if (iVar1 != 0) {
      start_idx = (ulong)*(uint *)(this->super_CVmObject).ext_ + 1;
      if ((ulong)(long)iVar1 <= start_idx) {
        start_idx = (long)iVar1;
      }
    }
    iVar1 = CVmBif::pop_int_val();
    uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
    if (uVar3 < start_idx) {
      cnt = 0;
    }
    else {
      cnt = (unsigned_long)iVar1;
      if (uVar3 < (cnt - 1) + start_idx) {
        cnt = (uVar3 - start_idx) + 1;
      }
    }
    save_undo(this,self,start_idx,cnt);
    copy_from(this,start_idx,src_arr,src_idx,cnt);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_copy_from(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(4);
    unsigned long dst_idx;
    unsigned long src_idx;
    unsigned long cnt;
    vm_obj_id_t src_arr_id;
    CVmObjByteArray *src_arr;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the source array */
    src_arr_id = CVmBif::pop_obj_val(vmg0_);

    /* make sure it is indeed an array */
    if (!is_byte_array(vmg_ src_arr_id))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* we know it's the right type, so cast it */
    src_arr = (CVmObjByteArray *)vm_objp(vmg_ src_arr_id);

    /* get the starting source index */
    src_idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be in range */
    if (src_idx < 1)
        src_idx = 1;
    else if (src_idx > src_arr->get_element_count() + 1)
        src_idx = src_arr->get_element_count() + 1;

    /* get the destination index */
    dst_idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be within range */
    if (dst_idx < 1)
        dst_idx = 1;
    else if (dst_idx > get_element_count() + 1)
        dst_idx = get_element_count() + 1;

    /* get the count */
    cnt = CVmBif::pop_int_val(vmg0_);

    /* limit the copying to the available destination space */
    if (dst_idx > get_element_count())
        cnt = 0;
    else if (dst_idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - dst_idx;

    /* save undo for the change */
    save_undo(vmg_ self, dst_idx, cnt);

    /* copy the data from the source array into our array */
    copy_from(dst_idx, src_arr, src_idx, cnt);

    /* the result is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}